

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

char * iniparser_getsecname(dictionary *d,int n)

{
  char *pcVar1;
  int local_24;
  int local_20;
  int foundsec;
  int i;
  int n_local;
  dictionary *d_local;
  
  if ((d == (dictionary *)0x0) || (n < 0)) {
    d_local = (dictionary *)0x0;
  }
  else {
    local_24 = 0;
    local_20 = 0;
    while (((long)local_20 < d->size &&
           (((d->key[local_20] == (char *)0x0 ||
             (pcVar1 = strchr(d->key[local_20],0x3a), pcVar1 != (char *)0x0)) ||
            (local_24 = local_24 + 1, local_24 <= n))))) {
      local_20 = local_20 + 1;
    }
    if (n < local_24) {
      d_local = (dictionary *)d->key[local_20];
    }
    else {
      d_local = (dictionary *)0x0;
    }
  }
  return (char *)d_local;
}

Assistant:

const char * iniparser_getsecname(const dictionary * d, int n)
{
    int i ;
    int foundsec ;

    if (d == NULL || n < 0) return NULL ;
    foundsec = 0 ;
    for (i = 0 ; i < d->size ; i++) {
        if (d->key[i] == NULL)
            continue ;
        if (strchr(d->key[i], ':') == NULL) {
            foundsec++ ;
            if (foundsec > n)
                break ;
        }
    }
    if (foundsec <= n) {
        return NULL ;
    }
    return d->key[i] ;
}